

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnmerge.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  FILE *__s;
  char *pcVar2;
  FILE *pFVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  FILE *__s_00;
  uint local_12f8;
  int top_count;
  int bottom_count;
  int layer_count;
  FILE *local_12e8;
  uint local_12dc;
  int blob_count;
  int magic;
  char **local_12d0;
  char *local_12c8;
  FILE *local_12c0;
  ulong local_12b8;
  ulong local_12b0;
  string ns;
  char layer_type [33];
  char layer_name [257];
  char bottom_name [257];
  char line [1024];
  
  local_12d0 = argv;
  if ((argc < 7) || ((argc - 1U & 1) != 0)) {
    fprintf(_stderr,"Usage: %s [param1] [bin1] [param2] [bin2] ... [outparam] [outbin]\n",*argv);
    iVar8 = -1;
  }
  else {
    pcVar2 = argv[argc - 1U];
    __s = fopen(argv[(ulong)(uint)argc - 2],"wb");
    local_12c0 = fopen(pcVar2,"wb");
    fwrite("7767517\n",8,1,__s);
    fwrite("           \n",0xc,1,__s);
    local_12b8 = (ulong)(argc - 3U >> 1);
    local_12dc = 0;
    local_12f8 = 0;
    uVar6 = 0;
    while (uVar6 != local_12b8) {
      pFVar3 = (FILE *)local_12d0[uVar6 * 2 + 1];
      local_12c8 = local_12d0[uVar6 * 2 + 2];
      local_12b0 = uVar6;
      pcVar2 = strrchr((char *)pFVar3,0x2f);
      __s_00 = (FILE *)(pcVar2 + 1);
      if (pcVar2 == (char *)0x0) {
        __s_00 = pFVar3;
      }
      local_12e8 = pFVar3;
      pcVar2 = strrchr((char *)__s_00,0x2e);
      if (pcVar2 == (char *)0x0) {
        std::__cxx11::string::string((string *)&ns,(char *)__s_00,(allocator *)line);
      }
      else {
        std::__cxx11::string::string((string *)line,(char *)__s_00,(allocator *)layer_name);
        std::__cxx11::string::substr((ulong)&ns,(ulong)line);
        std::__cxx11::string::~string((string *)line);
      }
      pFVar3 = fopen((char *)local_12e8,"rb");
      if (pFVar3 == (FILE *)0x0) {
        fprintf(_stderr,"fopen %s failed\n",local_12e8);
      }
      else {
        magic = 0;
        uVar1 = __isoc99_fscanf(pFVar3,"%d",&magic);
        if ((uVar1 == 1) && (magic == 0x7685dd)) {
          layer_count = 0;
          blob_count = 0;
          uVar1 = __isoc99_fscanf(pFVar3,"%d %d",&layer_count,&blob_count);
          if (uVar1 == 2) {
            local_12dc = local_12dc + layer_count;
            local_12f8 = local_12f8 + blob_count;
            for (iVar8 = 0; iVar8 < layer_count; iVar8 = iVar8 + 1) {
              bottom_count = 0;
              top_count = 0;
              uVar1 = __isoc99_fscanf(pFVar3,"%32s %256s %d %d",layer_type,layer_name,&bottom_count,
                                      &top_count);
              if (uVar1 != 4) {
                pcVar2 = "read layer params failed %d\n";
                goto LAB_0010156c;
              }
              fprintf(__s,"%-24s %s/%-24s %d %d",layer_type,ns._M_dataplus._M_p,layer_name,
                      (ulong)(uint)bottom_count,top_count);
              for (iVar7 = 0; iVar7 < bottom_count; iVar7 = iVar7 + 1) {
                uVar1 = __isoc99_fscanf(pFVar3,"%256s",bottom_name);
                if (uVar1 != 1) {
                  pcVar2 = "read bottom_name failed %d\n";
                  goto LAB_0010156c;
                }
                fprintf(__s," %s/%s",ns._M_dataplus._M_p,bottom_name);
              }
              for (iVar7 = 0; iVar7 < top_count; iVar7 = iVar7 + 1) {
                uVar1 = __isoc99_fscanf(pFVar3,"%256s",bottom_name);
                if (uVar1 != 1) {
                  pcVar2 = "read top_name failed %d\n";
                  goto LAB_0010156c;
                }
                fprintf(__s," %s/%s",ns._M_dataplus._M_p,bottom_name);
              }
              pcVar2 = fgets(line,0x400,pFVar3);
              if (pcVar2 == (char *)0x0) {
                fprintf(_stderr,"read line %s failed\n",local_12e8);
                break;
              }
              fputs(line,__s);
            }
            fclose(pFVar3);
            goto LAB_001015f4;
          }
          pcVar2 = "read layer_count and blob_count failed %d\n";
        }
        else {
          pcVar2 = "read magic failed %d\n";
        }
LAB_0010156c:
        fprintf(_stderr,pcVar2,(ulong)uVar1);
      }
LAB_001015f4:
      std::__cxx11::string::~string((string *)&ns);
      pFVar3 = fopen(local_12c8,"rb");
      if (pFVar3 == (FILE *)0x0) {
        fprintf(_stderr,"fopen %s failed\n",local_12c8);
      }
      else {
        fseek(pFVar3,0,2);
        lVar4 = ftell(pFVar3);
        local_12e8 = pFVar3;
        rewind(pFVar3);
        for (iVar8 = 0; pFVar3 = local_12e8, iVar7 = (int)lVar4, iVar8 + 0xfff < iVar7;
            iVar8 = iVar8 + (int)sVar5) {
          sVar5 = fread(line,1,0x1000,local_12e8);
          sVar5 = fwrite(line,1,sVar5,local_12c0);
        }
        sVar5 = fread(line,1,(long)(iVar7 - iVar8),local_12e8);
        sVar5 = fwrite(line,1,sVar5,local_12c0);
        if ((int)sVar5 + iVar8 != iVar7) {
          fprintf(_stderr,"copy %s incomplete\n",local_12c8);
        }
        fclose(pFVar3);
      }
      uVar6 = local_12b0 + 1;
    }
    rewind(__s);
    fwrite("7767517\n",8,1,__s);
    iVar8 = 0;
    fprintf(__s,"%d %d",(ulong)local_12dc,(ulong)local_12f8);
    fclose(__s);
    fclose(local_12c0);
  }
  return iVar8;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc < 7 || (argc - 1) % 2 != 0)
    {
        fprintf(stderr, "Usage: %s [param1] [bin1] [param2] [bin2] ... [outparam] [outbin]\n", argv[0]);
        return -1;
    }

    const char* outparampath = argv[argc - 2];
    const char* outbinpath = argv[argc - 1];

    FILE* outparamfp = fopen(outparampath, "wb");
    FILE* outbinfp = fopen(outbinpath, "wb");

    // magic
    fprintf(outparamfp, "7767517\n");

    // layer count and blob count placeholder
    // 99999 is large enough I think  --- nihui
    fprintf(outparamfp, "           \n");

    int total_layer_count = 0;
    int total_blob_count = 0;

    const int model_count = (argc - 3) / 2;

    for (int i = 0; i < model_count; i++)
    {
        const char* parampath = argv[i * 2 + 1];
        const char* binpath = argv[i * 2 + 2];

        copy_param(parampath, outparamfp, &total_layer_count, &total_blob_count);
        copy_bin(binpath, outbinfp);
    }

    // the real layer count and blob count
    rewind(outparamfp);
    fprintf(outparamfp, "7767517\n");
    fprintf(outparamfp, "%d %d", total_layer_count, total_blob_count);

    fclose(outparamfp);
    fclose(outbinfp);

    return 0;
}